

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_define(mpc_parser_t *p,mpc_parser_t *a)

{
  mpc_parser_t *__ptr;
  mpc_parser_t *a2;
  mpc_parser_t *a_local;
  mpc_parser_t *p_local;
  
  if (p->retained == '\0') {
    __ptr = mpc_failf("Attempt to assign to Unretained Parser!");
    p->type = __ptr->type;
    memcpy(&p->data,&__ptr->data,0x28);
    free(__ptr);
  }
  else {
    p->type = a->type;
    memcpy(&p->data,&a->data,0x28);
  }
  free(a);
  return p;
}

Assistant:

mpc_parser_t *mpc_define(mpc_parser_t *p, mpc_parser_t *a) {

  if (p->retained) {
    p->type = a->type;
    p->data = a->data;
  } else {
    mpc_parser_t *a2 = mpc_failf("Attempt to assign to Unretained Parser!");
    p->type = a2->type;
    p->data = a2->data;
    free(a2);
  }

  free(a);
  return p;
}